

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint32_t RegNo_02;
  uint uVar1;
  uint Opcode;
  uint Rs;
  uint Rt2;
  uint Rn;
  uint Rt;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  RegNo_01 = fieldFromInstruction(insn,10,5);
  RegNo_02 = fieldFromInstruction(insn,0x10,5);
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 - 0x3a3 < 3) goto LAB_001a4513;
  if (uVar1 == 0x3a6) goto LAB_001a4540;
  if (uVar1 == 0x3a7) {
LAB_001a456a:
    DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
    DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
    goto LAB_001a45d0;
  }
  if (uVar1 == 0x3a8) {
LAB_001a45a8:
    DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
    DecodeGPR64RegisterClass(Inst,RegNo_01,Addr,Decoder);
    goto LAB_001a45d0;
  }
  if (uVar1 - 0x3a9 < 3) goto LAB_001a4513;
  if (uVar1 == 0x3ac) goto LAB_001a4540;
  if (uVar1 == 0x427) goto LAB_001a456a;
  if (uVar1 == 0x428) goto LAB_001a45a8;
  if (uVar1 - 0x429 < 3) {
LAB_001a4513:
    DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
  }
  else {
    if (uVar1 != 0x42c) {
      if (uVar1 - 0x737 < 3) goto LAB_001a4513;
      if (uVar1 != 0x73a) {
        if (uVar1 == 0x73b) {
LAB_001a4556:
          DecodeGPR32RegisterClass(Inst,RegNo_02,Addr,Decoder);
          goto LAB_001a456a;
        }
        if (uVar1 == 0x73c) {
LAB_001a4594:
          DecodeGPR32RegisterClass(Inst,RegNo_02,Addr,Decoder);
          goto LAB_001a45a8;
        }
        if (uVar1 - 0x73d < 3) {
LAB_001a44ff:
          DecodeGPR32RegisterClass(Inst,RegNo_02,Addr,Decoder);
          goto LAB_001a4513;
        }
        if (uVar1 != 0x740) {
          if (uVar1 == 0x78f) goto LAB_001a4556;
          if (uVar1 == 0x790) goto LAB_001a4594;
          if (uVar1 - 0x791 < 3) goto LAB_001a44ff;
          if (uVar1 != 0x794) {
            return MCDisassembler_Fail;
          }
        }
        DecodeGPR32RegisterClass(Inst,RegNo_02,Addr,Decoder);
      }
    }
LAB_001a4540:
    DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
  }
LAB_001a45d0:
  DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
  if (((((uVar1 == 0x3a7) || (uVar1 == 0x427)) || (uVar1 == 0x3a8)) || (uVar1 == 0x428)) &&
     (RegNo == RegNo_01)) {
    Inst_local._4_4_ = MCDisassembler_SoftFail;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	unsigned Rs = fieldFromInstruction(insn, 16, 5);
	unsigned Opcode = MCInst_getOpcode(Inst);

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_STLXRW:
		case AArch64_STLXRB:
		case AArch64_STLXRH:
		case AArch64_STXRW:
		case AArch64_STXRB:
		case AArch64_STXRH:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARW:
		case AArch64_LDARB:
		case AArch64_LDARH:
		case AArch64_LDAXRW:
		case AArch64_LDAXRB:
		case AArch64_LDAXRH:
		case AArch64_LDXRW:
		case AArch64_LDXRB:
		case AArch64_LDXRH:
		case AArch64_STLRW:
		case AArch64_STLRB:
		case AArch64_STLRH:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXRX:
		case AArch64_STXRX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARX:
		case AArch64_LDAXRX:
		case AArch64_LDXRX:
		case AArch64_STLRX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXPW:
		case AArch64_STXPW:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPW:
		case AArch64_LDXPW:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_STLXPX:
		case AArch64_STXPX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPX:
		case AArch64_LDXPX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);

	// You shouldn't load to the same register twice in an instruction...
	if ((Opcode == AArch64_LDAXPW || Opcode == AArch64_LDXPW ||
				Opcode == AArch64_LDAXPX || Opcode == AArch64_LDXPX) &&
			Rt == Rt2)
		return SoftFail;

	return Success;
}